

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.h
# Opt level: O0

void MCTS::assertion_failed(char *expr,char *file_cstr,int line)

{
  ostream *poVar1;
  runtime_error *this;
  char *pcVar2;
  int in_EDX;
  char *in_RSI;
  char *in_RDI;
  stringstream sout;
  size_type pos;
  string file;
  stringstream local_200 [16];
  ostream local_1f0 [376];
  string local_78 [32];
  long local_58;
  allocator local_39;
  string local_38 [36];
  int local_14;
  char *local_8;
  
  local_14 = in_EDX;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,in_RSI,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_58 = std::__cxx11::string::find_last_of((char *)local_38,0x1f6b21);
  if (local_58 == -1) {
    local_58 = 0;
  }
  std::__cxx11::string::substr((ulong)local_78,(ulong)local_38);
  std::__cxx11::string::operator=(local_38,local_78);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::stringstream::stringstream(local_200);
  poVar1 = std::operator<<(local_1f0,"Assertion failed: ");
  poVar1 = std::operator<<(poVar1,local_8);
  poVar1 = std::operator<<(poVar1," in ");
  poVar1 = std::operator<<(poVar1,local_38);
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_14);
  std::operator<<(poVar1,".");
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::runtime_error::runtime_error(this,pcVar2);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void assertion_failed(const char* expr, const char* file_cstr, int line)
{
	using namespace std;

	// Extract the file name only.
	string file(file_cstr);
	auto pos = file.find_last_of("/\\");
	if (pos == string::npos) {
		pos = 0;
	}
	file = file.substr(pos + 1);  // Returns empty string if pos + 1 == length.

	stringstream sout;
	sout << "Assertion failed: " << expr << " in " << file << ":" << line << ".";
	throw runtime_error(sout.str().c_str());
}